

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<JsUtil::CharacterBuffer<char16_t>,JsUtil::CharacterBuffer<char16_t>,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
::FindEntryWithKey<JsUtil::CharacterBuffer<char16_t>>
          (BaseDictionary<JsUtil::CharacterBuffer<char16_t>,JsUtil::CharacterBuffer<char16_t>,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
           *this,CharacterBuffer<char16_t> *key)

{
  long lVar1;
  char16_t *pcVar2;
  bool bVar3;
  hash_t hVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  DictionaryStats *this_00;
  CharacterBuffer<char16_t> local_58;
  long local_48;
  uint local_3c;
  BaseDictionary<JsUtil::CharacterBuffer<char16_t>,JsUtil::CharacterBuffer<char16_t>,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
  *local_38;
  
  lVar1 = *(long *)this;
  uVar5 = 0;
  local_38 = this;
  if (lVar1 != 0) {
    hVar4 = CharacterBuffer::operator_cast_to_unsigned_int((CharacterBuffer *)key);
    uVar5 = BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::GetBucket(hVar4 * 2 + 1,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar7 = *(uint *)(lVar1 + (ulong)uVar5 * 4);
    uVar5 = 0;
    if (-1 < (int)uVar7) {
      lVar1 = *(long *)(local_38 + 8);
      uVar5 = 0;
      local_48 = lVar1;
      do {
        uVar6 = (ulong)uVar7;
        pcVar2 = *(char16_t **)(lVar1 + uVar6 * 0x18);
        local_3c = uVar7;
        Memory::Recycler::WBSetBit((char *)&local_58);
        local_58.string.ptr = pcVar2;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_58);
        local_58.len = *(Type *)(lVar1 + 8 + uVar6 * 0x18);
        bVar3 = CharacterBuffer<char16_t>::operator==(&local_58,key);
        if (bVar3) {
          this_00 = *(DictionaryStats **)(local_38 + 0x30);
          uVar7 = local_3c;
          goto LAB_00b456e3;
        }
        uVar5 = uVar5 + 1;
        uVar7 = *(uint *)(local_48 + uVar6 * 0x18 + 0x10);
      } while (-1 < (int)uVar7);
    }
  }
  this_00 = *(DictionaryStats **)(local_38 + 0x30);
  uVar7 = 0xffffffff;
LAB_00b456e3:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar5);
  }
  return uVar7;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }